

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.h
# Opt level: O2

int fy_emit_accum_utf8_put(fy_emit_accum *ea,int c)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  byte bVar4;
  _Bool _Var5;
  uint uVar6;
  undefined7 extraout_var;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar7;
  
  bVar4 = (byte)c;
  if (c < 0x80) {
    uVar10 = 1;
  }
  else if ((uint)c < 0x800) {
    uVar10 = 2;
  }
  else {
    uVar10 = 4 - (ulong)((uint)c < 0x10000);
  }
  do {
    uVar7 = ea->next;
    uVar8 = ea->alloc - uVar7;
    if (uVar10 <= uVar8) {
      if (0x10ffff < c || (c & 0xfffff800U) == 0xd800) break;
      pcVar3 = ea->accum;
      if (c < 0x80) {
        pcVar3[uVar7] = bVar4;
      }
      else {
        uVar9 = 2;
        if (0x7ff < (uint)c) {
          uVar9 = 4 - (ulong)((uint)c < 0x10000);
        }
        if (uVar8 < uVar9) break;
        if ((uint)c < 0x800) {
          pcVar3[uVar7] = (byte)((uint)c >> 6) | 0xc0;
          pcVar3[uVar7 + 1] = bVar4 & 0x3f | 0x80;
        }
        else if ((uint)c < 0x10000) {
          pcVar3[uVar7] = (byte)((uint)c >> 0xc) | 0xe0;
          pcVar3[uVar7 + 1] = (byte)((uint)c >> 6) & 0x3f | 0x80;
          pcVar3[uVar7 + 2] = bVar4 & 0x3f | 0x80;
        }
        else {
          pcVar3[uVar7] = (byte)((uint)c >> 0x12) | 0xf0;
          pcVar3[uVar7 + 1] = (byte)((uint)c >> 0xc) & 0x3f | 0x80;
          pcVar3[uVar7 + 2] = (byte)((uint)c >> 6) & 0x3f | 0x80;
          pcVar3[uVar7 + 3] = bVar4 & 0x3f | 0x80;
        }
      }
      ea->next = ea->next + uVar10;
      ea->utf8_count = ea->utf8_count + 1;
      _Var5 = fy_is_lb(c);
      uVar7 = CONCAT71(extraout_var,_Var5);
      if (_Var5) {
        ea->col = 0;
      }
      else if (c == 9) {
        iVar1 = ea->col;
        iVar2 = ea->ts;
        uVar7 = (long)iVar1 / (long)iVar2 & 0xffffffff;
        ea->col = (iVar1 + iVar2) - iVar1 % iVar2;
      }
      else {
        ea->col = ea->col + 1;
      }
      break;
    }
    uVar6 = fy_emit_accum_grow(ea);
    uVar7 = (ulong)uVar6;
  } while (uVar6 == 0);
  return (int)uVar7;
}

Assistant:

static inline int
fy_emit_accum_utf8_put(struct fy_emit_accum *ea, int c) {
    size_t w;
    char *ss;
    int ret;

    /* grow if needed */
    w = fy_utf8_width(c);
    while (w > (ea->alloc - ea->next)) {
        ret = fy_emit_accum_grow(ea);
        if (ret != 0)
            return ret;
    }
    ss = fy_utf8_put(ea->accum + ea->next, ea->alloc - ea->next, c);
    if (!ss)
        return -1;
    ea->next += w;
    ea->utf8_count++;
    if (fy_is_lb(c))
        ea->col = 0;
    else if (fy_is_tab(c))
        ea->col += (ea->ts - (ea->col % ea->ts));
    else
        ea->col++;

    return 0;
}